

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
swap_l<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage>
          (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *this,
          basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *other)

{
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> bVar1;
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> bVar2;
  half_storage hVar3;
  undefined8 uVar4;
  int64_t iVar5;
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> bVar6;
  common_storage cVar7;
  int64_t iVar8;
  ulong uVar9;
  bool_storage temp;
  undefined4 auStack_8c [5];
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *pbStack_78;
  undefined4 auStack_44 [5];
  
  bVar6 = *(basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)&other->field_0;
  switch((byte)bVar6 & 0xf) {
  case 0:
  case 4:
    cVar7 = (other->field_0).common_;
    iVar8 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar8;
    goto LAB_002a04c1;
  case 1:
    bVar6 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)
            (other->field_0).boolean_.val_;
    cVar7 = (other->field_0).common_;
    iVar8 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar8;
    this[2] = bVar6;
LAB_002a04c1:
    *(common_storage *)this = cVar7;
    return;
  default:
    uVar4 = *(undefined8 *)&other->field_0;
    iVar8 = (other->field_0).int64_.val_;
    iVar5 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar5;
    *(undefined8 *)this = uVar4;
    *(int64_t *)(this + 8) = iVar8;
    return;
  case 6:
    hVar3 = (other->field_0).half_float_;
    iVar8 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar8;
    *(half_storage *)this = hVar3;
    return;
  case 7:
    bVar1 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    uVar9 = (ulong)((byte)bVar6 >> 2 & 0xfffffffc);
    memcpy(auStack_44,(void *)((long)&other->field_0 + 4),uVar9);
    auStack_44[(byte)bVar6 >> 4] = 0;
    iVar8 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar8;
    *this = bVar6;
    this[1] = bVar1;
    memcpy(this + 4,auStack_44,uVar9);
    *(undefined4 *)(this + (ulong)((byte)bVar6 >> 4) * 4 + 4) = 0;
    return;
  case 10:
  case 0xb:
    bVar6 = *(basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)&other->field_0;
    pbStack_78 = this;
    switch((byte)bVar6 & 0xf) {
    case 0:
    case 4:
      cVar7 = (other->field_0).common_;
      iVar8 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar8;
      goto LAB_002a060d;
    case 1:
      bVar6 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)
              (other->field_0).boolean_.val_;
      cVar7 = (other->field_0).common_;
      iVar8 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar8;
      this[2] = bVar6;
LAB_002a060d:
      *(common_storage *)this = cVar7;
      return;
    default:
      uVar4 = *(undefined8 *)&other->field_0;
      iVar8 = (other->field_0).int64_.val_;
      iVar5 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar5;
      *(undefined8 *)this = uVar4;
      *(int64_t *)(this + 8) = iVar8;
      return;
    case 6:
      hVar3 = (other->field_0).half_float_;
      iVar8 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar8;
      *(half_storage *)this = hVar3;
      return;
    case 7:
      bVar1 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      uVar9 = (ulong)((byte)bVar6 >> 2 & 0xfffffffc);
      memcpy(auStack_8c,(void *)((long)&other->field_0 + 4),uVar9);
      auStack_8c[(byte)bVar6 >> 4] = 0;
      iVar8 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar8;
      *this = bVar6;
      this[1] = bVar1;
      memcpy(this + 4,auStack_8c,uVar9);
      *(undefined4 *)(this + (ulong)((byte)bVar6 >> 4) * 4 + 4) = 0;
      return;
    case 10:
    case 0xb:
      bVar6 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)
              (other->field_0).boolean_.val_;
      cVar7 = (other->field_0).common_;
      bVar1 = *this;
      (other->field_0).json_const_pointer_ =
           (json_const_reference_storage)
           ((byte)(other->field_0).json_const_pointer_ & 0xf0 | (byte)bVar1 & 0xf);
      bVar2 = *this;
      (other->field_0).json_const_pointer_ =
           (json_const_reference_storage)((byte)bVar2 & 0xf0 | (byte)bVar1 & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      memcpy((void *)((long)&other->field_0 + 4),this + 4,(ulong)((byte)*this >> 2 & 0xfffffffc));
      *(undefined4 *)((long)&other->field_0 + (ulong)((byte)bVar2 >> 4) * 4 + 4) = 0;
      *(common_storage *)this = cVar7;
      this[2] = bVar6;
      return;
    case 0xc:
      bVar6 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      iVar8 = (other->field_0).int64_.val_;
      iVar5 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar5;
      *this = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)0xc;
      break;
    case 0xd:
      bVar6 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      iVar8 = (other->field_0).int64_.val_;
      iVar5 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar5;
      *this = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)0xd;
      break;
    case 0xe:
      bVar6 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      iVar8 = (other->field_0).int64_.val_;
      iVar5 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar5;
      *this = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)0xe;
      break;
    case 0xf:
      bVar6 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)
              (other->field_0).common_.tag_;
      iVar8 = (other->field_0).int64_.val_;
      iVar5 = *(int64_t *)(this + 8);
      *(undefined8 *)&other->field_0 = *(undefined8 *)this;
      (other->field_0).int64_.val_ = iVar5;
      *this = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)0xf;
    }
    this[1] = bVar6;
    *(int64_t *)(this + 8) = iVar8;
    return;
  case 0xc:
    bVar6 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    iVar8 = (other->field_0).int64_.val_;
    iVar5 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar5;
    *this = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)0xc;
    break;
  case 0xd:
    bVar6 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    iVar8 = (other->field_0).int64_.val_;
    iVar5 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar5;
    *this = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)0xd;
    break;
  case 0xe:
    bVar6 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    iVar8 = (other->field_0).int64_.val_;
    iVar5 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar5;
    *this = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)0xe;
    break;
  case 0xf:
    bVar6 = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)
            (other->field_0).common_.tag_;
    iVar8 = (other->field_0).int64_.val_;
    iVar5 = *(int64_t *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).int64_.val_ = iVar5;
    *this = (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>)0xf;
  }
  this[1] = bVar6;
  *(int64_t *)(this + 8) = iVar8;
  return;
}

Assistant:

void swap_l(basic_json& other) noexcept
        {
            switch (other.storage_kind())
            {
                case json_storage_kind::null         : swap_l_r<TypeL, null_storage>(other); break;
                case json_storage_kind::empty_object : swap_l_r<TypeL, empty_object_storage>(other); break;
                case json_storage_kind::boolean         : swap_l_r<TypeL, bool_storage>(other); break;
                case json_storage_kind::int64        : swap_l_r<TypeL, int64_storage>(other); break;
                case json_storage_kind::uint64       : swap_l_r<TypeL, uint64_storage>(other); break;
                case json_storage_kind::half_float         : swap_l_r<TypeL, half_storage>(other); break;
                case json_storage_kind::float64       : swap_l_r<TypeL, double_storage>(other); break;
                case json_storage_kind::short_str : swap_l_r<TypeL, short_string_storage>(other); break;
                case json_storage_kind::long_str  : swap_l_r<TypeL, long_string_storage>(other); break;
                case json_storage_kind::byte_str  : swap_l_r<TypeL, byte_string_storage>(other); break;
                case json_storage_kind::array        : swap_l_r<TypeL, array_storage>(other); break;
                case json_storage_kind::object       : swap_l_r<TypeL, object_storage>(other); break;
                case json_storage_kind::json_const_reference : swap_l_r<TypeL, json_const_reference_storage>(other); break;
                case json_storage_kind::json_reference : swap_l_r<TypeL, json_reference_storage>(other); break;
                default:
                    JSONCONS_UNREACHABLE();
                    break;
            }
        }